

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseBuilder::section(BaseBuilder *this,Section *section)

{
  Error EVar1;
  SectionNode *node;
  BaseNode *local_20;
  
  EVar1 = sectionNodeOf(this,(SectionNode **)&local_20,section->_id);
  if (EVar1 == 0) {
    if ((char)local_20[0x11] < '\0') {
      if (this->_dirtySectionLinks == true) {
        updateSectionLinks(this);
      }
      if (*(undefined8 **)(local_20 + 0x38) == (undefined8 *)0x0) {
        local_20 = *(BaseNode **)&this->field_0x1a8;
      }
      else {
        local_20 = (BaseNode *)**(undefined8 **)(local_20 + 0x38);
      }
    }
    else {
      addAfter(this,local_20,*(BaseNode **)&this->field_0x1a8);
    }
    this->_cursor = local_20;
  }
  return EVar1;
}

Assistant:

Error BaseBuilder::section(Section* section) {
  SectionNode* node;
  ASMJIT_PROPAGATE(sectionNodeOf(&node, section->id()));
  ASMJIT_ASSUME(node != nullptr);

  if (!node->isActive()) {
    // Insert the section at the end if it was not part of the code.
    addAfter(node, lastNode());
    _cursor = node;
  }
  else {
    // This is a bit tricky. We cache section links to make sure that
    // switching sections doesn't involve traversal in linked-list unless
    // the position of the section has changed.
    if (hasDirtySectionLinks())
      updateSectionLinks();

    if (node->_nextSection)
      _cursor = node->_nextSection->_prev;
    else
      _cursor = _nodeList.last();
  }

  return kErrorOk;
}